

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O2

void SampleConv_toU8(void *buffer,INT32 value)

{
  char cVar1;
  
  cVar1 = '\x7f';
  if (value >> 0x10 < 0x7f) {
    cVar1 = (char)((uint)value >> 0x10);
  }
  cVar1 = cVar1 + -0x80;
  if (value >> 0x10 < -0x80) {
    cVar1 = '\0';
  }
  *(char *)buffer = cVar1;
  return;
}

Assistant:

static void SampleConv_toU8(void* buffer, INT32 value)
{
	value >>= 16;	// 24 bit -> 8 bit
	if (value < -0x80)
		value = -0x80;
	else if (value > +0x7F)
		value = +0x7F;
	*(UINT8*)buffer = (UINT8)(0x80 + value);
	return;
}